

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

void __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::
iterator::iterator(iterator *this,
                  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *src,
                  bool v)

{
  undefined3 in_register_00000011;
  
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::GroupByState
            (&this->source,src);
  this->valid = v;
  if (CONCAT31(in_register_00000011,v) != 0) {
    GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::Init(&this->source);
    this->valid = (_Rb_tree_header *)(this->source).current._M_node !=
                  &(this->source).result._M_t._M_impl.super__Rb_tree_header;
  }
  return;
}

Assistant:

iterator(S src, bool v = true) : source(src) {
				valid = v;
				
				if(v) { 
					source.Init();	
					valid = source.Valid();
				}
			}